

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkPlayer.cpp
# Opt level: O0

turn_t * __thiscall
NetworkPlayer::get_turn
          (turn_t *__return_storage_ptr__,NetworkPlayer *this,Board *board,
          vector<std::tuple<Point,_Point,_char>,_std::allocator<std::tuple<Point,_Point,_char>_>_>
          *turns,map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
                 *possible_moves,
          map<Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
          *possible_play_moves,Color color,uint turn)

{
  ostream *poVar1;
  allocator<char> local_61;
  string local_60;
  char local_3e [5];
  Color local_39;
  char buffer [5];
  map<Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
  *pmStack_38;
  Color color_local;
  map<Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
  *possible_play_moves_local;
  map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  *possible_moves_local;
  vector<std::tuple<Point,_Point,_char>,_std::allocator<std::tuple<Point,_Point,_char>_>_>
  *turns_local;
  Board *board_local;
  NetworkPlayer *this_local;
  
  local_39 = color & WHITE;
  pmStack_38 = possible_play_moves;
  read(this->m_socket,local_3e,5);
  poVar1 = std::operator<<((ostream *)&std::cout,"Turn: ");
  poVar1 = std::operator<<(poVar1,local_3e);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,local_3e,&local_61);
  Player::string_to_turn(__return_storage_ptr__,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return __return_storage_ptr__;
}

Assistant:

turn_t NetworkPlayer::get_turn(Board &board, const vector<tuple<Point, Point, char>> &turns,
                               map<Point, set<Point>> possible_moves, map<Point, map<Point, play>> possible_play_moves,
                               Color color, unsigned int turn) {
    char buffer[5];

    // Read turn.
    read(m_socket, &buffer, 5);
    cout << "Turn: " << buffer << endl;

    // Convert and return.
    return string_to_turn(buffer);
}